

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O3

bool __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
HandleLogicalArgs<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::CoshId>>
          (Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CoshId>
                 *con,int param_2)

{
  int local_54;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  _Any_data local_30;
  code *local_20;
  
  std::function<void_(int)>::function
            ((function<void_(int)> *)&local_30,(function<void_(int)> *)(this + 0x20));
  std::function<void_(int)>::function
            ((function<void_(int)> *)&local_50,(function<void_(int)> *)&local_30);
  local_54 = (con->
             super_CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::CoshId>).
             args_._M_elems[0];
  if (local_40 != (code *)0x0) {
    (*local_38)(&local_50,&local_54);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
    if (local_20 != (code *)0x0) {
      (*local_20)(&local_30,&local_30,__destroy_functor);
    }
    return false;
  }
  std::__throw_bad_function_call();
}

Assistant:

bool HandleLogicalArgs(const Con& con, int ) {
    VisitArguments(con, MarkVarIfLogical_);          // Mark as proper vars
    return false;                                    // don't remove immediately
  }